

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

void __thiscall lattice::graph::print(graph *this,ostream *os)

{
  pointer psVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  char local_43 [3];
  ulong local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"dimension: ",0xb);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"number of sites: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"number of bonds: ",0x11);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((this->sites_).
      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->sites_).
      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"site: ",6);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," type: ",7);
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          (this->sites_).
                          super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar3].type);
      local_43[0] = ' ';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_43,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"( ",2);
      local_38 = (this->coordinates_).
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar3;
      local_40 = uVar3;
      poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         *)&local_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ) neighbors[ ",0xe);
      psVar1 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&psVar1[uVar3].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
          *(pointer *)
           &psVar1[uVar3].neighbors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl) {
        uVar4 = 0;
        do {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          local_43[1] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_43 + 1,1);
          uVar4 = uVar4 + 1;
          psVar1 = (this->sites_).
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&psVar1[uVar3].neighbors.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl + 8) -
                                 *(long *)&psVar1[uVar3].neighbors.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"] neighbor_bonds[ ",0x12);
      psVar1 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&psVar1[uVar3].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
          *(pointer *)
           &psVar1[uVar3].neighbors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl) {
        uVar4 = 0;
        do {
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
          local_43[2] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_43 + 2,1);
          uVar4 = uVar4 + 1;
          psVar1 = (this->sites_).
                   super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&psVar1[uVar3].neighbors.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl + 8) -
                                 *(long *)&psVar1[uVar3].neighbors.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"]\n",2);
      uVar3 = local_40 + 1;
    } while (uVar3 < (ulong)(((long)(this->sites_).
                                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->sites_).
                                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void print(std::ostream& os = std::cout) const {
    os << "dimension: " << dimension() << std::endl
       << "number of sites: " << num_sites() << std::endl
       << "number of bonds: " << num_bonds() << std::endl;
    for (std::size_t s = 0; s < num_sites(); ++s) {
      os << "site: " << s << " type: " << site_type(s) << ' '
         << "( " << coordinate(s).transpose() << " ) neighbors[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor(s, k) << ' ';
      os << "] neighbor_bonds[ ";
      for (std::size_t k = 0; k < num_neighbors(s); ++k)
        os << neighbor_bond(s, k) << ' ';
      os << "]\n";
    }
  }